

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

void Ifn_NtkMatchCollectConfig(Ifn_Ntk_t *p,sat_solver *pSat,word *pConfig)

{
  int iVar1;
  uint local_2c;
  int local_28;
  int Mint;
  int v;
  int i;
  word *pConfig_local;
  sat_solver *pSat_local;
  Ifn_Ntk_t *p_local;
  
  if (p->nParsVNum < 5) {
    for (Mint = 0; Mint < p->nInps; Mint = Mint + 1) {
      local_2c = 0;
      for (local_28 = 0; local_28 < p->nParsVNum; local_28 = local_28 + 1) {
        iVar1 = sat_solver_var_value(pSat,p->nParsVIni + Mint * p->nParsVNum + local_28);
        if (iVar1 != 0) {
          local_2c = 1 << ((byte)local_28 & 0x1f) | local_2c;
        }
      }
      Abc_TtSetHex(pConfig,Mint,local_2c);
    }
    for (local_28 = p->nObjs; local_28 < p->nParsVIni; local_28 = local_28 + 1) {
      iVar1 = sat_solver_var_value(pSat,local_28);
      if (iVar1 != 0) {
        Abc_TtSetBit(pConfig + 1,local_28 - p->nObjs);
      }
    }
    return;
  }
  __assert_fail("p->nParsVNum <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                ,0x51c,"void Ifn_NtkMatchCollectConfig(Ifn_Ntk_t *, sat_solver *, word *)");
}

Assistant:

void Ifn_NtkMatchCollectConfig( Ifn_Ntk_t * p, sat_solver * pSat, word * pConfig )
{
    int i, v, Mint;
    assert( p->nParsVNum <= 4 );
    for ( i = 0; i < p->nInps; i++ )
    {
        for ( Mint = v = 0; v < p->nParsVNum; v++ )
            if ( sat_solver_var_value(pSat, p->nParsVIni + i * p->nParsVNum + v) )
                Mint |= (1 << v);
        Abc_TtSetHex( pConfig, i, Mint );
    }
    for ( v = p->nObjs; v < p->nParsVIni; v++ )
        if ( sat_solver_var_value(pSat, v) )
            Abc_TtSetBit( pConfig + 1, v - p->nObjs );
}